

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

void xercesc_4_0::XMLInitializer::initializeXMLScanner(void)

{
  XMLMutex *this;
  size_t in_RSI;
  
  gMsgLoader = XMLPlatformUtils::loadMsgSet(L"http://apache.org/xml/messages/XMLErrors");
  if (gMsgLoader == (XMLMsgLoader *)0x0) {
    XMLPlatformUtils::panic(Panic_CantLoadMsgDomain);
  }
  this = (XMLMutex *)XMemory::operator_new((XMemory *)0x10,in_RSI);
  XMLMutex::XMLMutex(this,XMLPlatformUtils::fgMemoryManager);
  sScannerMutex = this;
  return;
}

Assistant:

void XMLInitializer::initializeXMLScanner()
{
    gMsgLoader = XMLPlatformUtils::loadMsgSet(XMLUni::fgXMLErrDomain);

    if (!gMsgLoader)
      XMLPlatformUtils::panic(PanicHandler::Panic_CantLoadMsgDomain);

    sScannerMutex = new XMLMutex(XMLPlatformUtils::fgMemoryManager);
}